

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::BlockHandle::LoadFromBuffer
          (BufferHandle *__return_storage_ptr__,BlockHandle *this,BlockLock *l,data_ptr_t data,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer,BufferPoolReservation *reservation)

{
  BlockManager *block_manager;
  data_ptr_t __dest;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Block_*,_false> _Var2;
  pointer pBVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Block_*,_false> local_48;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_40;
  enable_shared_from_this<duckdb::BlockHandle> local_38;
  
  block_manager = this->block_manager;
  local_40._M_head_impl =
       (reusable_buffer->
       super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  (reusable_buffer->super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
  AllocateBlock((duckdb *)&local_48,block_manager,
                (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
                &local_40,this->block_id);
  if (local_40._M_head_impl != (FileBuffer *)0x0) {
    (*(local_40._M_head_impl)->_vptr_FileBuffer[1])();
  }
  local_40._M_head_impl = (FileBuffer *)0x0;
  pBVar3 = unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true>::operator->
                     ((unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> *)
                      &local_48);
  __dest = (pBVar3->super_FileBuffer).internal_buffer;
  pBVar3 = unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true>::operator->
                     ((unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> *)
                      &local_48);
  switchD_00917c1c::default(__dest,data,(pBVar3->super_FileBuffer).internal_size);
  _Var2._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (Block *)0x0;
  _Var1._M_head_impl =
       (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
  super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl =
       &(_Var2._M_head_impl)->super_FileBuffer;
  if (_Var1._M_head_impl != (FileBuffer *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_FileBuffer + 8))();
  }
  LOCK();
  (this->state)._M_i = BLOCK_LOADED;
  UNLOCK();
  LOCK();
  (this->readers).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->memory_charge).tag = reservation->tag;
  (this->memory_charge).size = reservation->size;
  reservation->size = 0;
  enable_shared_from_this<duckdb::BlockHandle>::shared_from_this(&local_38);
  BufferHandle::BufferHandle
            (__return_storage_ptr__,(shared_ptr<duckdb::BlockHandle,_true> *)&local_38,
             (optional_ptr<duckdb::FileBuffer,_true>)
             (this->buffer).
             super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
             super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
             super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.__weak_this_.internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_48._M_head_impl != (Block *)0x0) {
    (*((local_48._M_head_impl)->super_FileBuffer)._vptr_FileBuffer[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BufferHandle BlockHandle::LoadFromBuffer(BlockLock &l, data_ptr_t data, unique_ptr<FileBuffer> reusable_buffer,
                                         BufferPoolReservation reservation) {
	VerifyMutex(l);

	D_ASSERT(state != BlockState::BLOCK_LOADED);
	D_ASSERT(readers == 0);
	// copy over the data into the block from the file buffer
	auto block = AllocateBlock(block_manager, std::move(reusable_buffer), block_id);
	memcpy(block->InternalBuffer(), data, block->AllocSize());
	buffer = std::move(block);
	state = BlockState::BLOCK_LOADED;
	readers = 1;
	memory_charge = std::move(reservation);
	return BufferHandle(shared_from_this(), buffer.get());
}